

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_hydration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined2 uVar1;
  OBJ_DATA *pOVar2;
  uint uVar3;
  int iVar4;
  OBJ_DATA **ppOVar5;
  char *pcVar6;
  bool bVar7;
  
  bVar7 = false;
  ppOVar5 = &ch->in_room->contents;
  while (pOVar2 = *ppOVar5, pOVar2 != (OBJ_DATA *)0x0) {
    if (pOVar2->item_type == 0x19) {
      bVar7 = true;
    }
    ppOVar5 = &pOVar2->next_content;
  }
  switch(ch->in_room->sector_type) {
  default:
    iVar4 = 4;
    break;
  case 2:
  case 3:
    iVar4 = 8;
    goto LAB_0035a27c;
  case 4:
  case 5:
    iVar4 = 6;
LAB_0035a27c:
    uVar3 = dice(iVar4,10);
    if (bVar7) {
      uVar3 = (uint)((float)(int)uVar3 * 1.5);
    }
    goto LAB_0035a2bf;
  case 0xc:
  case 0xd:
    uVar3 = 0;
    goto LAB_0035a2bf;
  case 0xf:
    dice(0xc,10);
  case 6:
  case 8:
    iVar4 = 0x10;
  }
  uVar3 = dice(iVar4,10);
LAB_0035a2bf:
  if ((ch->in_room->area->sky == 3) && (uVar1 = ch->in_room->sector_type, 2 < (ushort)(uVar1 - 6)))
  {
    iVar4 = dice(4,10);
    uVar3 = uVar3 + iVar4;
  }
  pcVar6 = "You draw upon the water in your surroundings to revitalize $N.";
  if ((CHAR_DATA *)vo == ch) {
    pcVar6 = "You draw upon the water in your surroundings to revitalize yourself.";
  }
  act(pcVar6,ch,(void *)0x0,vo,3);
  if (uVar3 == 0) {
    pcVar6 = "The flames burn up all moisture around you!";
  }
  else if ((int)uVar3 < 0x1f) {
    pcVar6 = "You feel slightly more vigorous as moisture bathes your skin.";
  }
  else {
    pcVar6 = "You feel your wounds mending rapidly as the life-giving water fills you with vigor!";
    if (uVar3 < 0x51) {
      pcVar6 = "A renewed energy surges through your limbs as the healing waters wash over you.";
    }
  }
  act(pcVar6,(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
  iVar4 = uVar3 + *(int *)((long)vo + 0x158);
  if (*(short *)((long)vo + 0x15c) <= iVar4) {
    iVar4 = (int)*(short *)((long)vo + 0x15c);
  }
  *(int *)((long)vo + 0x158) = iVar4;
  return;
}

Assistant:

void spell_hydration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int heal = 0;
	OBJ_DATA *obj;
	bool spring = false;

	for (obj = ch->in_room->contents; obj; obj = obj->next_content)
	{
		if (obj->item_type == ITEM_FOUNTAIN)
			spring = true;
	}

	switch (ch->in_room->sector_type)
	{
		case SECT_CITY:
			heal = dice(4, 10);
			break;
		case SECT_DESERT:
			heal = dice(4, 10);
			break;
		case SECT_ROAD:
			heal = dice(4, 10);
			break;
		case SECT_AIR:
			heal = dice(4, 10);
			break;
		case SECT_INSIDE:
			heal = dice(4, 10);
			break;
		case SECT_HILLS:
			heal = dice(6, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_MOUNTAIN:
			heal = dice(6, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_FIELD:
			heal = dice(8, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_FOREST:
			heal = dice(8, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_SWAMP:
			heal = dice(12, 10);
		case SECT_WATER:
			heal = dice(16, 10);
			break;
		case SECT_UNDERWATER:
			heal = dice(16, 10);
			break;
		case SECT_CONFLAGRATION:
			heal = 0;
			break;
		case SECT_BURNING:
			heal = 0;
			break;
		default:
			heal = dice(4, 10);
			break;
	}

	if (ch->in_room->area->sky == WeatherCondition::Drizzle
		&& ch->in_room->sector_type != SECT_WATER
		&& ch->in_room->sector_type != SECT_INSIDE
		&& ch->in_room->sector_type != SECT_UNDERWATER)
	{
		heal += dice(4, 10);
	}

	if (victim == ch)
		act("You draw upon the water in your surroundings to revitalize yourself.", ch, 0, victim, TO_CHAR);
	else
		act("You draw upon the water in your surroundings to revitalize $N.", ch, 0, victim, TO_CHAR);

	if (heal == 0)
		act("The flames burn up all moisture around you!", victim, 0, 0, TO_CHAR);
	else if (heal <= 30)
		act("You feel slightly more vigorous as moisture bathes your skin.", victim, 0, 0, TO_CHAR);
	else if (heal <= 80)
		act("A renewed energy surges through your limbs as the healing waters wash over you.", victim, 0, 0, TO_CHAR);
	else
		act("You feel your wounds mending rapidly as the life-giving water fills you with vigor!", victim, 0, 0, TO_CHAR);

	victim->hit = std::min(victim->hit + heal, (int)victim->max_hit);
}